

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O1

int Test_SUNMatScaleAdd2(SUNMatrix A,SUNMatrix B,N_Vector x,N_Vector y,N_Vector z)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  uVar3 = SUNMatClone();
  x_00 = (N_Vector)N_VClone(y);
  y_00 = (N_Vector)N_VClone(y);
  uVar1 = SUNMatCopy(A,uVar3);
  uVar5 = uVar3;
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAdd(0x3ff0000000000000,uVar3,B);
    if (uVar1 == 0) {
      uVar1 = SUNMatMatvec(uVar3,x,x_00);
      if (uVar1 == 0) {
        N_VLinearSum(0x3ff0000000000000,0,y,z,y_00);
        iVar2 = check_vector(x_00,y_00,2.220446049250313e-14);
        if (iVar2 != 0) {
          puts(">>> FAILED test -- SUNMatScaleAdd2 check 1 ");
          puts("\nA =");
          SUNSparseMatrix_Print(A,_stdout);
          puts("\nB =");
          SUNSparseMatrix_Print(B,_stdout);
          puts("\nC =");
          SUNSparseMatrix_Print(uVar3,_stdout);
          puts("\nx =");
          N_VPrint_Serial(x);
          puts("\ny =");
          N_VPrint_Serial(y);
          puts("\nz =");
          N_VPrint_Serial(z);
          puts("\nu =");
          N_VPrint_Serial(x_00);
          puts("\nv =");
          N_VPrint_Serial(y_00);
          iVar2 = 1;
          goto LAB_001034b6;
        }
        puts("    PASSED test -- SUNMatScaleAdd2 check 1 ");
        uVar4 = SUNMatClone(A);
        SUNSparseMatrix_Reallocate
                  (uVar4,*(long *)((long)B->content + 0x10) + *(long *)((long)A->content + 0x10));
        uVar1 = SUNMatCopy(A,uVar4);
        uVar5 = uVar4;
        if (uVar1 == 0) {
          uVar1 = SUNMatScaleAdd(0x3ff0000000000000,uVar4,B);
          if (uVar1 != 0) {
            pcVar6 = ">>> FAILED test -- SUNMatScaleAdd returned %d \n";
            goto LAB_001036a1;
          }
          uVar1 = SUNMatMatvec(uVar4,x,x_00);
          if (uVar1 != 0) {
            pcVar6 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
            goto LAB_001036a1;
          }
          N_VLinearSum(0x3ff0000000000000,0,y,z,y_00);
          iVar2 = check_vector(x_00,y_00,2.220446049250313e-14);
          if (iVar2 != 0) {
            puts(">>> FAILED test -- SUNMatScaleAdd2 check 2 ");
            puts("\nA =");
            SUNSparseMatrix_Print(A,_stdout);
            puts("\nB =");
            SUNSparseMatrix_Print(B,_stdout);
            puts("\nD =");
            SUNSparseMatrix_Print(uVar4,_stdout);
            puts("\nx =");
            N_VPrint_Serial(x);
            puts("\ny =");
            N_VPrint_Serial(y);
            puts("\nz =");
            N_VPrint_Serial(z);
            puts("\nu =");
            N_VPrint_Serial(x_00);
            puts("\nv =");
            N_VPrint_Serial(y_00);
LAB_001037ce:
            SUNMatDestroy(uVar3);
            iVar2 = 1;
            goto LAB_001034b6;
          }
          puts("    PASSED test -- SUNMatScaleAdd2 check 2 ");
          uVar5 = SUNMatClone(uVar3);
          uVar1 = SUNMatCopy(uVar3,uVar5);
          if (uVar1 == 0) {
            uVar1 = SUNMatScaleAdd(0xbff0000000000000,uVar5,B);
            if (uVar1 == 0) {
              uVar1 = SUNMatMatvec(uVar5,x,x_00);
              if (uVar1 != 0) {
                printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                SUNMatDestroy(uVar3);
                SUNMatDestroy(uVar4);
                iVar2 = 1;
                goto LAB_001034b6;
              }
              N_VLinearSum(0xbff0000000000000,0,y,z,y_00);
              iVar2 = check_vector(x_00,y_00,2.220446049250313e-14);
              if (iVar2 == 0) {
                puts("    PASSED test -- SUNMatScaleAdd2 check 3 ");
                SUNMatDestroy(uVar3);
                SUNMatDestroy(uVar4);
                iVar2 = 0;
                goto LAB_001034b6;
              }
              puts(">>> FAILED test -- SUNMatScaleAdd2 check 3 ");
              puts("\nA =");
              SUNSparseMatrix_Print(A,_stdout);
              puts("\nB =");
              SUNSparseMatrix_Print(B,_stdout);
              puts("\nC =");
              SUNSparseMatrix_Print(uVar3,_stdout);
              puts("\nE =");
              SUNSparseMatrix_Print(uVar5,_stdout);
              puts("\nx =");
              N_VPrint_Serial(x);
              puts("\ny =");
              N_VPrint_Serial(y);
              puts("\nu =");
              N_VPrint_Serial(x_00);
              puts("\nv =");
              N_VPrint_Serial(y_00);
              SUNMatDestroy(uVar3);
              uVar3 = uVar4;
              goto LAB_001037ce;
            }
            pcVar6 = ">>> FAILED test -- SUNMatScaleAdd returned %d \n";
          }
          else {
            pcVar6 = ">>> FAILED test -- SUNMatCopy returned %d \n";
          }
          printf(pcVar6,(ulong)uVar1);
          SUNMatDestroy(uVar3);
          uVar3 = uVar4;
        }
        else {
          pcVar6 = ">>> FAILED test -- SUNMatCopy returned %d \n";
LAB_001036a1:
          printf(pcVar6,(ulong)uVar1);
        }
        SUNMatDestroy(uVar3);
      }
      else {
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
      }
      iVar2 = 1;
      goto LAB_001034b6;
    }
    pcVar6 = ">>> FAILED test -- SUNMatScaleAdd returned %d \n";
  }
  else {
    pcVar6 = ">>> FAILED test -- SUNMatCopy returned %d \n";
  }
  printf(pcVar6,(ulong)uVar1);
  iVar2 = 1;
LAB_001034b6:
  SUNMatDestroy(uVar5);
  N_VDestroy(x_00);
  N_VDestroy(y_00);
  return iVar2;
}

Assistant:

int Test_SUNMatScaleAdd2(SUNMatrix A, SUNMatrix B, N_Vector x, N_Vector y,
                         N_Vector z)
{
  int failure;
  SUNMatrix C, D, E;
  N_Vector u, v;
  sunrealtype tol = 100 * SUN_UNIT_ROUNDOFF;

  /* create clones for test */
  C = SUNMatClone(A);
  u = N_VClone(y);
  v = N_VClone(y);

  /* test 1: add A to B (output must be enlarged) */
  failure = SUNMatCopy(A, C); /* C = A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatScaleAdd(ONE, C, B); /* C = A+B */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatMatvec(C, x, u); /* u = Cx = Ax+Bx */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  N_VLinearSum(ONE, y, ONE, z, v);   /* v = y+z */
  failure = check_vector(u, v, tol); /* u ?= v */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd2 check 1 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nu =\n");
    N_VPrint_Serial(u);
    printf("\nv =\n");
    N_VPrint_Serial(v);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAdd2 check 1 \n"); }

  /* test 2: add A to a matrix with sufficient but misplaced storage */
  D       = SUNMatClone(A);
  failure = SUNSparseMatrix_Reallocate(D, SM_NNZ_S(A) + SM_NNZ_S(B));
  failure = SUNMatCopy(A, D); /* D = A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatScaleAdd(ONE, D, B); /* D = A+B */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatMatvec(D, x, u); /* u = Cx = Ax+Bx */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  N_VLinearSum(ONE, y, ONE, z, v);   /* v = y+z */
  failure = check_vector(u, v, tol); /* u ?= v */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd2 check 2 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nD =\n");
    SUNSparseMatrix_Print(D, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nu =\n");
    N_VPrint_Serial(u);
    printf("\nv =\n");
    N_VPrint_Serial(v);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAdd2 check 2 \n"); }

  /* test 3: add A to a matrix with the appropriate structure already in place */
  E       = SUNMatClone(C);
  failure = SUNMatCopy(C, E); /* E = A + B */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatScaleAdd(NEG_ONE, E, B); /* E = -A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatMatvec(E, x, u); /* u = Ex = -Ax */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  N_VLinearSum(NEG_ONE, y, ZERO, z, v); /* v = -y */
  failure = check_vector(u, v, tol);    /* v ?= u */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd2 check 3 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C, stdout);
    printf("\nE =\n");
    SUNSparseMatrix_Print(E, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    printf("\nu =\n");
    N_VPrint_Serial(u);
    printf("\nv =\n");
    N_VPrint_Serial(v);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAdd2 check 3 \n"); }

  SUNMatDestroy(C);
  SUNMatDestroy(D);
  SUNMatDestroy(E);
  N_VDestroy(u);
  N_VDestroy(v);
  return (0);
}